

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

bool QtPrivate::sequential_erase_one<QList<int>,int>(QList<int> *c,int *t)

{
  int *piVar1;
  int *piVar2;
  const_iterator abegin;
  
  piVar2 = (c->d).ptr;
  piVar1 = piVar2 + (c->d).size;
  abegin = std::__find_if<QList<int>::const_iterator,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (piVar2,piVar1,t);
  if (abegin.i != piVar1) {
    QList<int>::erase(c,abegin,(const_iterator)(abegin.i + 1));
  }
  return abegin.i != piVar1;
}

Assistant:

auto sequential_erase_one(Container &c, const T &t)
{
    const auto cend = c.cend();
    const auto it = std::find(c.cbegin(), cend, t);
    if (it == cend)
        return false;
    c.erase(it);
    return true;
}